

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O2

double do_oper(stack<double,_std::deque<double,_std::allocator<double>_>_> *temp,char oper)

{
  _Elt_pointer pdVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  
  pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pdVar1 == (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  dVar3 = pdVar1[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&temp->c);
  pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pdVar1 == (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  dVar4 = pdVar1[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&temp->c);
  switch((int)oper) {
  case 0x2a:
    dVar4 = dVar3 * dVar4;
    break;
  case 0x2b:
    dVar4 = dVar3 + dVar4;
    break;
  case 0x2d:
    dVar4 = dVar4 - dVar3;
    break;
  case 0x2f:
    dVar4 = dVar4 / dVar3;
    break;
  default:
    if (oper == 0x5e) {
      dVar3 = pow(dVar4,dVar3);
      return dVar3;
    }
  case 0x2c:
  case 0x2e:
    poVar2 = std::operator<<((ostream *)&std::cout,"invalid operator ");
    poVar2 = std::operator<<(poVar2,oper);
    std::endl<char,std::char_traits<char>>(poVar2);
    dVar4 = 0.0;
  }
  return dVar4;
}

Assistant:

double do_oper (stack<double>& temp, char oper) {
    double b = temp.top(); temp.pop();  // порядок считывания
    double a = temp.top(); temp.pop();
    switch (oper) {
        case '+':
            return a + b;
        case '-':
            return a - b;
        case '*':
            return a * b;
        case '/':
            return a / b;
        case '^':
            return pow(a,b);
        default:
            cout << "invalid operator " << oper << endl;
            return 0;
    }
}